

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

int Acb_NtkCollectMfsGates
              (char *pFileName,Vec_Ptr_t *vNamesRefed,Vec_Ptr_t *vNamesDerefed,int *nGates)

{
  int iVar1;
  int iVar2;
  Acb_ObjType_t AVar3;
  Acb_Ntk_t *pNtk;
  Vec_Int_t *vNamesInv;
  Vec_Int_t *vObjsRefed;
  Vec_Int_t *vObjsDerefed;
  Vec_Int_t *p;
  int iVar4;
  int i;
  int iVar5;
  long lVar6;
  
  iVar4 = 0;
  pNtk = Acb_VerilogSimpleRead(pFileName,(char *)0x0);
  vNamesInv = Vec_IntInvert(&pNtk->vObjName,iVar4);
  vObjsRefed = Acb_NamesToIds(pNtk,vNamesInv,vNamesRefed);
  vObjsDerefed = Acb_NamesToIds(pNtk,vNamesInv,vNamesDerefed);
  p = Acb_NtkCollectMffc(pNtk,vObjsRefed,vObjsDerefed);
  iVar4 = p->nSize;
  Vec_IntFree(vNamesInv);
  Vec_IntFree(vObjsRefed);
  Vec_IntFree(vObjsDerefed);
  for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
    nGates[lVar6] = 0;
  }
  iVar5 = 0;
  i = 0;
  if (0 < iVar4) {
    iVar5 = iVar4;
    i = 0;
  }
  do {
    if (iVar5 == i) {
      Vec_IntFree(p);
      Acb_ManFree(pNtk->pDesign);
      return iVar4;
    }
    iVar1 = Vec_IntEntry(p,i);
    iVar2 = Acb_ObjFaninNum(pNtk,iVar1);
    AVar3 = Acb_ObjType(pNtk,iVar1);
    switch(AVar3 & 0xff) {
    case ABC_OPER_CO:
    case ABC_OPER_BIT_BUF:
      nGates[2] = nGates[2] + 1;
      break;
    default:
      if (iVar2 < 2) {
        __assert_fail("nFan >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                      ,0x127,"int Acb_NtkCollectMfsGates(char *, Vec_Ptr_t *, Vec_Ptr_t *, int *)");
      }
      iVar1 = Acb_ObjFaninNum(pNtk,iVar1);
      nGates[4] = iVar1 + nGates[4] + -1;
      break;
    case ABC_OPER_CONST_F:
      *nGates = *nGates + 1;
      break;
    case ABC_OPER_CONST_T:
      nGates[1] = nGates[1] + 1;
      break;
    case ABC_OPER_BIT_INV:
      nGates[3] = nGates[3] + 1;
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Acb_NtkCollectMfsGates( char * pFileName, Vec_Ptr_t * vNamesRefed, Vec_Ptr_t * vNamesDerefed, int nGates[5] )
{
    Acb_Ntk_t * pNtkF        = Acb_VerilogSimpleRead( pFileName, NULL );
    Vec_Int_t * vNamesInv    = Vec_IntInvert( &pNtkF->vObjName, 0 ) ;
    Vec_Int_t * vObjsRefed   = Acb_NamesToIds( pNtkF, vNamesInv, vNamesRefed );
    Vec_Int_t * vObjsDerefed = Acb_NamesToIds( pNtkF, vNamesInv, vNamesDerefed );
    Vec_Int_t * vNodes       = Acb_NtkCollectMffc( pNtkF, vObjsRefed, vObjsDerefed );
    int i, iObj, RetValue    = Vec_IntSize(vNodes);
    Vec_IntFree( vNamesInv );
    Vec_IntFree( vObjsRefed );
    Vec_IntFree( vObjsDerefed );
    for ( i = 0; i < 5; i++ )
        nGates[i] = 0;
    Vec_IntForEachEntry( vNodes, iObj, i )
    {
        int nFan = Acb_ObjFaninNum(pNtkF, iObj);
        int Type = Acb_ObjType( pNtkF, iObj );
        if ( Type == ABC_OPER_CONST_F ) 
            nGates[0]++;
        else if ( Type == ABC_OPER_CONST_T ) 
            nGates[1]++;
        else if ( Type == ABC_OPER_BIT_BUF || Type == ABC_OPER_CO ) 
            nGates[2]++;
        else if ( Type == ABC_OPER_BIT_INV ) 
            nGates[3]++;
        else
        {
            assert( nFan >= 2 );
            nGates[4] += Acb_ObjFaninNum(pNtkF, iObj)-1;
        }
    }
    Vec_IntFree( vNodes );
    Acb_ManFree( pNtkF->pDesign );
    return RetValue;
}